

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_typeinfo.h
# Opt level: O0

bool __thiscall dukglue::detail::TypeInfo::can_cast<Dog>(TypeInfo *this)

{
  bool bVar1;
  type_index local_20;
  TypeInfo *local_18;
  TypeInfo *this_local;
  
  local_18 = this;
  std::type_index::type_index(&local_20,(type_info *)&Dog::typeinfo);
  bVar1 = std::type_index::operator==(&this->index_,&local_20);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else if (this->base_ == (TypeInfo *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = can_cast<Dog>(this->base_);
  }
  return this_local._7_1_;
}

Assistant:

bool can_cast() const {
				if (index_ == typeid(T))
					return true;

				if (base_)
					return base_->can_cast<T>();

				return false;
			}